

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::GetAnimationFileList
          (SMDImporter *this,string *pFile,IOSystem *pIOHandler,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outList)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 extraout_var;
  pointer pIVar3;
  undefined4 extraout_var_00;
  reference __s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  string local_190;
  char *local_170;
  char *p;
  char *context2;
  char *context1;
  char *tok2;
  char *tok1;
  string animPath;
  string animName;
  size_t fileSize;
  vector<char,_std::allocator<char>_> buf;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_e0;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  undefined1 local_68 [8];
  string name;
  string base;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *outList_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  SMDImporter *this_local;
  
  DefaultIOSystem::absolutePath((string *)((long)&name.field_2 + 8),pFile);
  DefaultIOSystem::completeBaseName((string *)local_68,pFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&name.field_2 + 8),"/");
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,"_animation.txt");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&file);
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,uVar2,"rb");
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_e0,
             (pointer)CONCAT44(extraout_var,iVar1));
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_e0)
  ;
  if (pIVar3 == (pointer)0x0) {
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 1;
  }
  else {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&fileSize);
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_e0);
    iVar1 = (*pIVar3->_vptr_IOStream[6])();
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)&fileSize,CONCAT44(extraout_var_00,iVar1) + 1)
    ;
    pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                       (&local_e0);
    BaseImporter::TextFileToBuffer
              (pIVar3,(vector<char,_std::allocator<char>_> *)&fileSize,FORBID_EMPTY);
    std::__cxx11::string::string((string *)(animPath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&tok1);
    __s = std::vector<char,_std::allocator<char>_>::operator[]
                    ((vector<char,_std::allocator<char>_> *)&fileSize,0);
    tok2 = strtok_r(__s,"\r\n",&context2);
    while (tok2 != (char *)0x0) {
      context1 = strtok_r(tok2," \t",&p);
      if (context1 != (char *)0x0) {
        local_170 = context1;
        context1 = strtok_r((char *)0x0," \t",&p);
        if (context1 == (char *)0x0) {
          std::__cxx11::string::operator=((string *)&tok1,local_170);
          DefaultIOSystem::completeBaseName(&local_190,(string *)&tok1);
          std::__cxx11::string::operator=
                    ((string *)(animPath.field_2._M_local_buf + 8),(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
        }
        else {
          std::__cxx11::string::operator=((string *)&tok1,context1);
          std::__cxx11::string::operator=((string *)(animPath.field_2._M_local_buf + 8),local_170);
        }
        std::operator+(&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&name.field_2 + 8),"/");
        std::operator+(&local_1f0,&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tok1);
        std::make_tuple<std::__cxx11::string&,std::__cxx11::string>
                  (&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&animPath.field_2 + 8),&local_1f0);
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(outList,&local_1d0);
        std::
        tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~tuple(&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
      }
      tok2 = strtok_r((char *)0x0,"\r\n",&context2);
    }
    std::__cxx11::string::~string((string *)&tok1);
    std::__cxx11::string::~string((string *)(animPath.field_2._M_local_buf + 8));
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&fileSize);
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  }
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_e0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void SMDImporter::GetAnimationFileList(const std::string &pFile, IOSystem* pIOHandler, std::vector<std::tuple<std::string, std::string>>& outList) {
    auto base = DefaultIOSystem::absolutePath(pFile);
    auto name = DefaultIOSystem::completeBaseName(pFile);
    auto path = base + "/" + name + "_animation.txt";

    std::unique_ptr<IOStream> file(pIOHandler->Open(path.c_str(), "rb"));
    if (file.get() == nullptr) {
        return;
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> buf;
    size_t fileSize = file->FileSize();
    buf.resize(fileSize + 1);
    TextFileToBuffer(file.get(), buf);

    /*
        *_animation.txt format:
        name path
        idle idle.smd
        jump anim/jump.smd
        walk.smd
        ...
    */
    std::string animName, animPath;
    char *tok1, *tok2;
    char *context1, *context2;

    tok1 = strtok_s(&buf[0], "\r\n", &context1);
    while (tok1 != NULL) {
        tok2 = strtok_s(tok1, " \t", &context2);
        if (tok2) {
            char *p = tok2;
            tok2 = strtok_s(nullptr, " \t", &context2);
            if (tok2) {
                animPath = tok2;
                animName = p;
            } else  {
                // No name
                animPath = p;
                animName = DefaultIOSystem::completeBaseName(animPath);
            }
            outList.push_back(std::make_tuple(animName, base + "/" + animPath));
        }
        tok1 = strtok_s(nullptr, "\r\n", &context1);
    }
}